

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O0

void __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::reset
          (KalmanFilterBase<4U,_3U,_0U> *this)

{
  KalmanFilterBase<4U,_3U,_0U> *this_local;
  
  ObserverBase<4U,_3U,_0U>::reset((ObserverBase<4U,_3U,_0U> *)this);
  IndexedMatrix<4U,_4U>::reset(&this->a_);
  IndexedMatrix<3U,_4U>::reset(&this->c_);
  IndexedMatrix<4U,_4U>::reset(&this->a_);
  IndexedMatrix<3U,_4U>::reset(&this->c_);
  IndexedMatrix<4U,_4U>::reset(&this->q_);
  IndexedMatrix<3U,_3U>::reset(&this->r_);
  IndexedMatrix<4U,_4U>::reset(&this->p_);
  return;
}

Assistant:

void KalmanFilterBase<n,m,p>::reset()
{
    ZeroDelayObserver<n,m,p>::reset();

    a_.reset();
    c_.reset();
    a_.reset();
    c_.reset();
    q_.reset();
    r_.reset();
    p_.reset();
}